

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.c
# Opt level: O0

int receive(int connection,void *buffer,int size,int busy_waiting)

{
  ssize_t sVar1;
  int *piVar2;
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  int in_EDI;
  int local_4;
  
  if (in_ECX == 0) {
    sVar1 = recv(in_EDI,in_RSI,(long)in_EDX,0);
    if (sVar1 < in_EDX) {
      local_4 = -1;
    }
    else {
LAB_001032ce:
      local_4 = 0;
    }
  }
  else {
    do {
      sVar1 = recv(in_EDI,in_RSI,(long)in_EDX,0);
      if (in_EDX <= sVar1) goto LAB_001032ce;
      piVar2 = __errno_location();
    } while (*piVar2 == 0xb);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int receive(int connection, void* buffer, int size, int busy_waiting) {
	if (busy_waiting) {
		while (recv(connection, buffer, size, 0) < size) {
			if (errno != EAGAIN) return -1;
		}
	} else if (recv(connection, buffer, size, 0) < size) {
		return -1;
	}

	return 0;
}